

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
::mutable_unknown_fields_slow
          (InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           *this)

{
  Container *pCVar1;
  ArenaImpl *in_RDI;
  Container *container;
  Arena *my_arena;
  size_t n;
  size_t in_stack_ffffffffffffff40;
  Arena *allocated_type;
  Arena *in_stack_ffffffffffffff50;
  ArenaImpl *pAVar2;
  Arena *local_78;
  __pointer_type local_38;
  
  pAVar2 = in_RDI;
  if (((uint)(in_RDI->threads_)._M_b._M_p & 1) == 1) {
    pCVar1 = InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
             ::
             PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                       ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                         *)in_RDI);
    local_78 = pCVar1->arena;
  }
  else {
    local_78 = PtrValue<google::protobuf::Arena>
                         ((InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                           *)in_RDI);
  }
  if (local_78 == (Arena *)0x0) {
    local_38 = (__pointer_type)operator_new(0x28);
    memset(local_38,0,0x28);
    Container::Container((Container *)0x3edca1);
  }
  else {
    allocated_type = local_78;
    AlignUpTo8(0x28);
    Arena::AllocHook(in_stack_ffffffffffffff50,(type_info *)allocated_type,in_stack_ffffffffffffff40
                    );
    local_38 = (__pointer_type)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (pAVar2,(size_t)in_RDI,(_func_void_void_ptr *)in_stack_ffffffffffffff50);
    memset(local_38,0,0x28);
    Container::Container((Container *)0x3edd8d);
  }
  (in_RDI->threads_)._M_b._M_p = local_38;
  (in_RDI->threads_)._M_b._M_p = (__pointer_type)((ulong)(in_RDI->threads_)._M_b._M_p | 1);
  local_38->next_ = (SerialArena *)local_78;
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
}

Assistant:

PROTOBUF_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container* container = Arena::Create<Container>(my_arena);
    // Two-step assignment works around a bug in clang's static analyzer:
    // https://bugs.llvm.org/show_bug.cgi?id=34198.
    ptr_ = container;
    ptr_ = reinterpret_cast<void*>(reinterpret_cast<intptr_t>(ptr_) |
                                   kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }